

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

int Abc_NodeCompareCiCo(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  char *pcVar5;
  int local_24;
  int i;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtkOld_local;
  
  iVar1 = Abc_NtkPiNum(pNtkOld);
  iVar2 = Abc_NtkPiNum(pNtkNew);
  if (iVar1 == iVar2) {
    iVar1 = Abc_NtkPoNum(pNtkOld);
    iVar2 = Abc_NtkPoNum(pNtkNew);
    if (iVar1 == iVar2) {
      iVar1 = Abc_NtkLatchNum(pNtkOld);
      iVar2 = Abc_NtkLatchNum(pNtkNew);
      if (iVar1 == iVar2) {
        for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtkOld), local_24 < iVar1; local_24 = local_24 + 1)
        {
          pAVar3 = Abc_NtkCi(pNtkOld,local_24);
          pcVar4 = Abc_ObjName(pAVar3);
          pAVar3 = Abc_NtkCi(pNtkNew,local_24);
          pcVar5 = Abc_ObjName(pAVar3);
          iVar1 = strcmp(pcVar4,pcVar5);
          if (iVar1 != 0) {
            return 0;
          }
        }
        for (local_24 = 0; iVar1 = Abc_NtkCoNum(pNtkOld), local_24 < iVar1; local_24 = local_24 + 1)
        {
          pAVar3 = Abc_NtkCo(pNtkOld,local_24);
          pcVar4 = Abc_ObjName(pAVar3);
          pAVar3 = Abc_NtkCo(pNtkNew,local_24);
          pcVar5 = Abc_ObjName(pAVar3);
          iVar1 = strcmp(pcVar4,pcVar5);
          if (iVar1 != 0) {
            return 0;
          }
        }
        pNtkOld_local._4_4_ = 1;
      }
      else {
        pNtkOld_local._4_4_ = 0;
      }
    }
    else {
      pNtkOld_local._4_4_ = 0;
    }
  }
  else {
    pNtkOld_local._4_4_ = 0;
  }
  return pNtkOld_local._4_4_;
}

Assistant:

int Abc_NodeCompareCiCo( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    int i;
    if ( Abc_NtkPiNum(pNtkOld) != Abc_NtkPiNum(pNtkNew) )
        return 0;
    if ( Abc_NtkPoNum(pNtkOld) != Abc_NtkPoNum(pNtkNew) )
        return 0;
    if ( Abc_NtkLatchNum(pNtkOld) != Abc_NtkLatchNum(pNtkNew) )
        return 0;
    for ( i = 0; i < Abc_NtkCiNum(pNtkOld); i++ )
        if ( strcmp(Abc_ObjName(Abc_NtkCi(pNtkOld, i)), Abc_ObjName(Abc_NtkCi(pNtkNew, i))) )
            return 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtkOld); i++ )
        if ( strcmp(Abc_ObjName(Abc_NtkCo(pNtkOld, i)), Abc_ObjName(Abc_NtkCo(pNtkNew, i))) )
            return 0;
    return 1;
}